

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall
OpenMD::P2R::P2R(P2R *this,SimInfo *info,string *filename,string *sele1,string *sele2,uint nbins)

{
  bool bVar1;
  undefined1 uVar2;
  string *in_RCX;
  SelectionEvaluator *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  string paramString;
  stringstream params;
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  string *in_stack_fffffffffffffd20;
  StaticAnalyser *this_00;
  SimInfo *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  allocator<char> *__a;
  SelectionEvaluator *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *script;
  string local_280 [32];
  stringstream local_260 [120];
  SimInfo *in_stack_fffffffffffffe18;
  SelectionEvaluator *in_stack_fffffffffffffe20;
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [89];
  SimInfo *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__P2R_0055fbf8;
  *(undefined1 *)&(in_RDI->compiler).cchScript = 0;
  *(undefined1 *)((long)&(in_RDI->compiler).cchScript + 1) = 0;
  std::__cxx11::string::string((string *)&(in_RDI->compiler).ichToken,in_RCX);
  script = (string *)&(in_RDI->compiler).ichCurrentCommand;
  std::__cxx11::string::string((string *)script,in_R8);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &(in_RDI->compiler).atokenInfix;
  SelectionManager::SelectionManager
            ((SelectionManager *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  this_01 = (SelectionEvaluator *)((long)&(in_RDI->errorMessage).field_2 + 8);
  SelectionManager::SelectionManager
            ((SelectionManager *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  __a = (allocator<char> *)&(in_RDI->distanceFinder).inversions_;
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  *(undefined4 *)
   &in_RDI[2].distanceFinder.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].distanceFinder.inversions_.
           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[2].distanceFinder.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  in_RDI[2].distanceFinder.inversions_.
  super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[2].distanceFinder.molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  SelectionEvaluator::loadScriptString(in_RDI,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&(in_RDI->distanceFinder).inversions_)
  ;
  if (!bVar1) {
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (SelectionSet *)in_stack_fffffffffffffd28);
    SelectionSet::~SelectionSet((SelectionSet *)0x193fa5);
  }
  SelectionEvaluator::loadScriptString(in_RDI,script);
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI[1].distanceFinder.inversions_)
  ;
  if (!(bool)uVar2) {
    in_stack_fffffffffffffd28 = (SimInfo *)((long)&(in_RDI->errorMessage).field_2 + 8);
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar2,in_stack_fffffffffffffd30),
               (SelectionSet *)in_stack_fffffffffffffd28);
    SelectionSet::~SelectionSet((SelectionSet *)0x194105);
  }
  this_00 = (StaticAnalyser *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)this_01,__a);
  StaticAnalyser::setAnalysisType
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  getPrefix((string *)in_stack_fffffffffffffd28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28,(char *)this_00);
  StaticAnalyser::setOutputName
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::stringstream::stringstream(local_260);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  std::__cxx11::string::~string(local_280);
  std::__cxx11::stringstream::~stringstream(local_260);
  return;
}

Assistant:

P2R::P2R(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      doVect_(false), doOffset_(false), selectionScript1_(sele1),
      selectionScript2_(sele2), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    setAnalysisType(
        "2nd order Legendre Polynomial Correlation using r as reference axis");
    setOutputName(getPrefix(filename) + ".P2R");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }